

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O2

void calc_mean_and_sd_weighted<float,int,std::vector<double,std::allocator<double>>,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean,vector<double,_std::allocator<double>_> *w
               )

{
  int *piVar1;
  ulong *puVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  unsigned_long *puVar6;
  int *piVar7;
  long lVar8;
  size_t row;
  double __z;
  double dVar9;
  double dVar10;
  ulong uVar11;
  double dVar12;
  double local_b8;
  double local_98;
  
  lVar8 = (long)Xc_indptr[col_num];
  lVar5 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    *x_sd = 0.0;
    *x_mean = 0.0;
    return;
  }
  piVar1 = Xc_ind + lVar5;
  iVar3 = piVar1[-1];
  puVar2 = ix_arr + end + 1;
  puVar6 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (ix_arr + st,puVar2);
  dVar10 = 0.0;
  for (; st <= end; st = st + 1) {
    dVar10 = dVar10 + (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[ix_arr[st]];
  }
  local_b8 = 0.0;
  local_98 = 0.0;
  __z = 0.0;
LAB_0024451d:
  piVar7 = Xc_ind + lVar8;
  do {
    if (((puVar6 == puVar2) || (lVar8 == lVar5)) || (uVar11 = *puVar6, (ulong)(long)iVar3 < uVar11))
    {
LAB_002446d7:
      dVar9 = 0.0;
      if ((local_b8 != 0.0) || (NAN(local_b8))) {
        if (local_b8 < dVar10) {
          __z = __z + (1.0 - local_b8 / dVar10) * local_b8 * local_98 * local_98;
          local_98 = local_98 * (local_b8 / dVar10);
        }
        *x_mean = local_98;
        dVar9 = SQRT(__z / dVar10);
      }
      else {
        *x_mean = 0.0;
      }
      *x_sd = dVar9;
      return;
    }
    if (*piVar7 == (int)uVar11) {
      dVar9 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar11];
      if ((uint)ABS(Xc[lVar8]) < 0x7f800000) {
        dVar12 = (double)Xc[lVar8];
        bVar4 = local_b8 == 0.0;
        uVar11 = ~-(ulong)bVar4 & (ulong)local_98;
        local_b8 = local_b8 + dVar9;
        local_98 = fma(dVar9,(dVar12 - local_98) / local_b8,local_98);
        __z = fma(dVar9,(dVar12 - (double)(uVar11 | -(ulong)bVar4 & (ulong)dVar12)) *
                        (dVar12 - local_98),__z);
      }
      else {
        dVar10 = dVar10 - dVar9;
      }
      if ((puVar6 == ix_arr + end) || (lVar8 == lVar5 + -1)) goto LAB_002446d7;
      puVar6 = puVar6 + 1;
      piVar7 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (piVar7 + 1,piVar1,puVar6);
      lVar8 = (long)piVar7 - (long)Xc_ind >> 2;
      goto LAB_0024451d;
    }
    if (*piVar7 <= (int)uVar11) break;
    puVar6 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                       (puVar6 + 1,puVar2,piVar7);
  } while( true );
  piVar7 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (piVar7 + 1,piVar1,puVar6);
  lVar8 = (long)piVar7 - (long)Xc_ind >> 2;
  goto LAB_0024451d;
}

Assistant:

void calc_mean_and_sd_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               double &restrict x_sd, double &restrict x_mean, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt -= w[*row];
            }

            else
            {
                w_this = w[*row];
                if (added == 0) m_prev = Xc[curr_pos];
                added += w_this;
                m = std::fma(w_this, (Xc[curr_pos] - m) / added, m);
                s = std::fma(w_this, (Xc[curr_pos] - m) * (Xc[curr_pos] - m_prev), s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * (added * ((ldouble_safe)1 - (ldouble_safe)added/(ldouble_safe)cnt));
        m *= added / cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (ldouble_safe)cnt);
}